

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::ComputeSolutionHDivT<double>
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZMaterialDataT<double> *data)

{
  TPZFNMatrix<110,_double> *A;
  TPZFNMatrix<20,_double> *this_00;
  long row;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  TPZManVector<double,_10> *pTVar6;
  TPZFNMatrix<30,_double> *pTVar7;
  TNode *pTVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  TPZCompMesh *pTVar12;
  TPZFMatrix<double> *this_01;
  ulong uVar13;
  double *pdVar14;
  Fad<double> *pFVar15;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  int j;
  ulong uVar19;
  int i;
  int iVar20;
  long col;
  int s;
  long lVar21;
  int i_2;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  long local_12e8;
  long local_12d0;
  long local_12c8;
  long local_12c0;
  TPZFNMatrix<4,_double> Grad0;
  TPZFNMatrix<3,_double> Normalvec;
  TPZFMatrix<double> GradOfPhiHdiv;
  TPZManVector<TPZFNMatrix<9,_double>,_18> GradNormalvec;
  
  plVar11 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xb8))();
  uVar9 = (**(code **)(*plVar11 + 0x78))(plVar11);
  uVar10 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0x90))(this);
  pTVar12 = TPZCompEl::Mesh((TPZCompEl *)this);
  this_01 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar12->fSolution);
  if ((this_01->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol != 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x24e);
  }
  TPZManVector<TPZManVector<double,_10>,_20>::Resize(&data->sol,1);
  TPZManVector<TPZFNMatrix<30,_double>,_20>::Resize(&data->dsol,1);
  TPZManVector<TPZManVector<double,_10>,_20>::Resize(&data->divsol,1);
  local_12e8 = 0;
  lVar21 = 0;
  lVar23 = 1;
  while (bVar24 = lVar23 != 0, lVar23 = lVar23 + -1, bVar24) {
    pTVar6 = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
    (**(code **)(*(long *)((long)pTVar6->fExtAlloc + lVar21 + -0x20) + 0x18))
              ((long)pTVar6->fExtAlloc + lVar21 + -0x20,(long)(int)(uVar9 * 3));
    GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
               lVar21 + -0x20),(double *)&GradNormalvec,0,-1);
    pTVar7 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
    (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                   (&((TPZFMatrix<double> *)
                                     (&(pTVar7->super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1
                                   ))->fPivot + 0xffffffffffffffff) + local_12e8) + 0x70))
              ((long)(&((TPZFMatrix<double> *)
                       (&((TPZFMatrix<double> *)(&(pTVar7->super_TPZFMatrix<double>).fPivot + -1))->
                         fPivot + -1))->fPivot + 0xffffffffffffffff) + local_12e8,
               (long)(int)(uVar9 * 3),3);
    pTVar6 = (data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore;
    (**(code **)(*(long *)((long)pTVar6->fExtAlloc + lVar21 + -0x20) + 0x18))
              ((long)pTVar6->fExtAlloc + lVar21 + -0x20,(long)(int)uVar9);
    GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::Fill
              ((TPZVec<double> *)
               ((long)((data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->fExtAlloc +
               lVar21 + -0x20),(double *)&GradNormalvec,0,-1);
    lVar21 = lVar21 + 0x70;
    local_12e8 = local_12e8 + 0x188;
  }
  TPZFMatrix<double>::TPZFMatrix(&GradOfPhiHdiv,3,3);
  memset(GradOfPhiHdiv.fElem,0,
         GradOfPhiHdiv.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         GradOfPhiHdiv.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  GradOfPhiHdiv.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  lVar23 = (long)(int)(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                      super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
  GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>._vptr_TPZVec = (_func_int **)0x0;
  TPZFNMatrix<3,_double>::TPZFNMatrix
            (&Normalvec,
             (long)(int)(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                        super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,lVar23,
             (double *)&GradNormalvec);
  TPZManVector<TPZFNMatrix<9,_double>,_18>::TPZManVector(&GradNormalvec,lVar23);
  A = &(data->super_TPZMaterialData).fDeformedDirections;
  lVar21 = 0;
  for (lVar23 = 0; lVar23 < GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fNElements;
      lVar23 = lVar23 + 1) {
    (**(code **)(*(long *)((long)(&((TPZFMatrix<double> *)
                                   (&((TPZFMatrix<double> *)
                                     (&((GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore)
                                       ->super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1))->
                                   fPivot + 0xffffffffffffffff) + lVar21) + 0x70))
              ((long)(&((TPZFMatrix<double> *)
                       (&((TPZFMatrix<double> *)
                         (&((GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore)->
                           super_TPZFMatrix<double>).fPivot + -1))->fPivot + -1))->fPivot +
                     0xffffffffffffffff) + lVar21,3,3);
    lVar21 = lVar21 + 0xe0;
  }
  if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == false) {
    TPZFMatrix<double>::operator=(&Normalvec.super_TPZFMatrix<double>,&A->super_TPZFMatrix<double>);
    pTVar12 = TPZCompEl::Mesh((TPZCompEl *)this);
    this_00 = &(data->super_TPZMaterialData).phi;
    uVar13 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar13 = 0;
    }
    uVar19 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar19 = 0;
    }
    local_12c8 = 0;
    local_12d0 = 0;
    local_12c0 = 0;
    for (iVar20 = 0; iVar20 != (int)uVar19; iVar20 = iVar20 + 1) {
      lVar23 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,iVar20);
      pTVar8 = (pTVar12->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      iVar5 = pTVar8[*(int *)(lVar23 + 8)].pos;
      uVar17 = (long)pTVar8[*(int *)(lVar23 + 8)].dim / (long)(int)uVar9;
      local_12c8 = (long)(int)local_12c8;
      local_12d0 = (long)(int)local_12d0;
      local_12c0 = (long)(int)local_12c0;
      uVar18 = uVar17 & 0xffffffff;
      if ((int)uVar17 < 1) {
        uVar18 = 0;
      }
      for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
        for (lVar23 = 0; lVar23 != 1; lVar23 = lVar23 + 1) {
          for (uVar22 = 0; uVar22 != uVar13; uVar22 = uVar22 + 1) {
            pdVar14 = TPZFMatrix<double>::operator()
                                (this_01,uVar17 * (long)(int)uVar9 + (long)iVar5 + uVar22,lVar23);
            dVar1 = *pdVar14;
            pdVar14 = TPZFMatrix<double>::operator()
                                (&this_00->super_TPZFMatrix<double>,local_12c8,0);
            dVar2 = *pdVar14;
            TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)&Grad0,3);
            for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
              if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == true) {
                pFVar15 = TPZFMatrix<Fad<double>_>::operator()
                                    (&(data->super_TPZMaterialData).fDeformedDirectionsFad,lVar21,
                                     local_12d0);
              }
              else {
                pFVar15 = (Fad<double> *)
                          TPZFMatrix<double>::operator()
                                    (&A->super_TPZFMatrix<double>,lVar21,local_12d0);
              }
              *(double *)
               (Grad0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
               lVar21 * 8) = pFVar15->val_;
            }
            pdVar16 = TPZFMatrix<double>::operator()
                                (&(data->super_TPZMaterialData).divphi.super_TPZFMatrix<double>,
                                 local_12c0,0);
            pdVar14 = (data->divsol).super_TPZVec<TPZManVector<double,_10>_>.fStore[lVar23].
                      super_TPZVec<double>.fStore;
            pdVar14[uVar22] = *pdVar16 * dVar1 + pdVar14[uVar22];
            for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
              row = lVar21 + uVar22 * 3;
              pdVar14 = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore[lVar23].
                        super_TPZVec<double>.fStore;
              pdVar14[row] = *(double *)
                              (Grad0.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow + lVar21 * 8) * dVar2 * dVar1 + pdVar14[row]
              ;
              for (col = 0; col != 3; col = col + 1) {
                pdVar14 = TPZFMatrix<double>::operator()(&GradOfPhiHdiv,lVar21,col);
                dVar3 = *pdVar14;
                pdVar14 = TPZFMatrix<double>::operator()
                                    (&(data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore
                                      [lVar23].super_TPZFMatrix<double>,row,col);
                *pdVar14 = dVar3 * dVar1 + *pdVar14;
                if ((data->super_TPZMaterialData).fNeedsDeformedDirectionsFad == true) {
                  pdVar14 = TPZFMatrix<double>::operator()
                                      (&GradNormalvec.super_TPZVec<TPZFNMatrix<9,_double>_>.fStore
                                        [local_12d0].super_TPZFMatrix<double>,lVar21,col);
                  dVar3 = *pdVar14;
                  pdVar14 = TPZFMatrix<double>::operator()
                                      (&this_00->super_TPZFMatrix<double>,local_12c8,0);
                  dVar4 = *pdVar14;
                  pdVar14 = TPZFMatrix<double>::operator()
                                      (&(data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore
                                        [lVar23].super_TPZFMatrix<double>,row,col);
                  *pdVar14 = dVar3 * dVar1 * dVar4 + *pdVar14;
                }
              }
            }
            TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&Grad0);
          }
        }
        local_12c0 = local_12c0 + 1;
        local_12d0 = local_12d0 + 1;
        local_12c8 = local_12c8 + 1;
      }
    }
    TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector(&GradNormalvec);
    TPZFNMatrix<3,_double>::~TPZFNMatrix(&Normalvec);
    TPZFMatrix<double>::~TPZFMatrix(&GradOfPhiHdiv);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp",
             0x26c);
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeSolutionHDivT(TPZMaterialDataT<TVar> &data)
{
    
    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }


    TPZFMatrix<TVar> GradOfPhiHdiv(dim,dim);
    GradOfPhiHdiv.Zero();


    int normvecRows = data.fDeformedDirections.Rows();
    int normvecCols = data.fDeformedDirections.Cols();
    TPZFNMatrix<3,REAL> Normalvec(normvecRows,normvecCols,0.);
    TPZManVector<TPZFNMatrix<9,REAL>,18> GradNormalvec(normvecCols);
    for (int i=0; i<GradNormalvec.size(); i++) {
        GradNormalvec[i].Redim(dim,dim);
    }

    if (data.fNeedsDeformedDirectionsFad) {
        // Needs to be rethought
        DebugStop();
        for (int e = 0; e < normvecRows; e++) {
            for (int s = 0; s < normvecCols; s++) {
                Normalvec(e,s)=data.fDeformedDirectionsFad(e,s).val();
            }
        }

        TPZFNMatrix<4,REAL> Grad0(3,3,0.);
        TPZGeoEl *ref = this->Reference();
        const int gel_dim = ref->Dimension();

        for (int s = 0; s < normvecCols; s++) {
            for (int i = 0; i < gel_dim; i++) {
                for (int j = 0; j < gel_dim; j++) {
                    Grad0(i,j)=data.fDeformedDirectionsFad(i,s).fastAccessDx(j);
                }
            }
            GradNormalvec[s] = Grad0;
        }

    }else{
        Normalvec=data.fDeformedDirections;
    }

    TPZBlock &block =this->Mesh()->Block();
    int ishape=0,ivec=0,counter=0;

    int nshapeV = data.fVecShapeIndex.NElements();

    for(int in=0; in<ncon; in++)
    {
        TPZConnect *df = &this->Connect(in);
        int64_t dfseq = df->SequenceNumber();
        int dfvar = block.Size(dfseq);
        // pos : position of the block in the solution matrix
        int64_t pos = block.Position(dfseq);

        /// ish loops of the number of shape functions associated with the block
        for(int ish=0; ish<dfvar/nstate; ish++)
        {
            for (int64_t is=0; is<numbersol; is++)
            {
                for(int idf=0; idf<nstate; idf++)
                {
                    TVar meshsol = MeshSol(pos+ish*nstate+idf,is);
                    REAL phival = data.phi(ishape,0);
                    TPZManVector<REAL,3> normal(3);

                    for (int i=0; i<3; i++)
                    {
                        if (data.fNeedsDeformedDirectionsFad) {
                            normal[i] = data.fDeformedDirectionsFad(i,ivec).val();
                        }else{
                            normal[i] = data.fDeformedDirections(i,ivec);
                        }
                    }

#ifdef PZ_LOG
                    if(logger.isDebugEnabled() && abs(meshsol) > 1.e-6)
                    {
                        std::stringstream sout;
                        sout << "meshsol = " << meshsol << " ivec " << ivec << " ishape " << ishape << " x " << data.x << std::endl;
                        sout << " phi = " << data.phi(ishape,0)  << std::endl;
                        sout << "normal = " << normal << std::endl;
//                        sout << "GradOfPhiHdiv " << GradOfPhiHdiv << std::endl;
                        sout << "GradNormalVec " << GradNormalvec[ivec] << std::endl;
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif

                    data.divsol[is][idf] += data.divphi(counter,0)*meshsol;
                    for (int ilinha=0; ilinha<dim; ilinha++) {
                        data.sol[is][ilinha+dim*idf] += normal[ilinha]*phival*meshsol;
                        for (int kdim = 0 ; kdim < dim; kdim++) {
                            data.dsol[is](ilinha+dim*idf,kdim)+= meshsol * GradOfPhiHdiv(ilinha,kdim);
                            if(data.fNeedsDeformedDirectionsFad){
                                data.dsol[is](ilinha+dim*idf,kdim)+=meshsol *GradNormalvec[ivec](ilinha,kdim)*data.phi(ishape,0);
                            }
                        }

                    }

                }
            }
            counter++;
            ivec++;
            ishape++;
        }
    }






#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "x " << data.x << " sol " << data.sol[0] << std::endl;
        data.dsol[0].Print("dsol",sout);
        sout << "divsol" << data.divsol[0] << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif

}